

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

int __thiscall
boost::deflate::deflate_stream_test::ZlibCompressor::init(ZlibCompressor *this,EVP_PKEY_CTX *ctx)

{
  int in_ECX;
  int in_EDX;
  int in_R8D;
  source_location local_c0;
  invalid_argument local_a8 [20];
  int local_94;
  undefined1 local_90 [4];
  int res;
  int local_20;
  int local_1c;
  int strategy_local;
  int memLevel_local;
  int windowBits_local;
  int level_local;
  ZlibCompressor *this_local;
  
  memLevel_local = (int)ctx;
  local_20 = in_R8D;
  local_1c = in_ECX;
  strategy_local = in_EDX;
  _windowBits_local = this;
  deflateEnd(&this->zs);
  memset(local_90,0,0x70);
  memcpy(&this->zs,local_90,0x70);
  local_94 = deflateInit2_(&this->zs,memLevel_local,8,-strategy_local,local_1c,local_20,"1.2.11",
                           0x70);
  if (local_94 != 0) {
    std::invalid_argument::invalid_argument(local_a8,"zlib compressor: bad arg");
    source_location::source_location
              (&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
               ,0x4a,
               "virtual void boost::deflate::deflate_stream_test::ZlibCompressor::init(int, int, int, int)"
               ,0);
    throw_exception<std::invalid_argument>(local_a8,&local_c0);
  }
  return 0;
}

Assistant:

void init(
            int level,
            int windowBits,
            int memLevel,
            int strategy) override
        {
            deflateEnd(&zs);
            zs = {};
            const auto res = deflateInit2(&zs, level, Z_DEFLATED, -windowBits, memLevel, strategy);
            if(res != Z_OK)
               BOOST_THROW_EXCEPTION(std::invalid_argument{"zlib compressor: bad arg"});
        }